

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O3

void brotli::ClusterHistograms<brotli::Histogram<704>>
               (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *in,
               size_t num_contexts,size_t num_blocks,size_t max_histograms,
               vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram_symbols)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *symbols;
  size_t symbols_size;
  size_t i;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  pointer pHVar4;
  long lVar5;
  ulong __n;
  double dVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cluster_size;
  allocator_type local_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  size_t local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  value_type_conflict local_34;
  
  __n = num_contexts * num_blocks;
  local_58 = max_histograms;
  if (__n + ((long)(in->
                   super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(in->
                   super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x43fa36f5e02e4851 == 0) {
    local_34 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_50,__n,&local_34,&local_61);
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize(out,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(histogram_symbols,__n);
    local_60 = histogram_symbols;
    if (__n != 0) {
      pHVar4 = (out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = 0;
      lVar5 = 0;
      do {
        memcpy((void *)((long)pHVar4->data_ + lVar2),
               (void *)((long)((in->
                               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar2),0xb10);
        dVar6 = PopulationCost<704>((Histogram<704> *)
                                    ((long)((in->
                                            super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->data_ +
                                    lVar2));
        pHVar4 = (out->
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)&pHVar4->bit_cost_ + lVar2) = dVar6;
        (histogram_symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
        .super__Vector_impl_data._M_start[lVar5] = (uint)lVar5;
        lVar5 = lVar5 + 1;
        lVar2 = lVar2 + 0xb10;
      } while (__n - lVar5 != 0);
      lVar2 = 0;
      uVar1 = 0;
      uVar3 = __n;
      do {
        symbols_size = 0x40;
        if (uVar3 < 0x40) {
          symbols_size = uVar3;
        }
        HistogramCombine<brotli::Histogram<704>>
                  ((out->
                   super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (uint32_t *)
                   ((long)(local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar2),symbols_size,local_58)
        ;
        uVar1 = uVar1 + 0x40;
        uVar3 = uVar3 - 0x40;
        lVar2 = lVar2 + 0x100;
      } while (uVar1 < __n);
    }
    symbols = local_60;
    HistogramCombine<brotli::Histogram<704>>
              ((out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
               local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,__n,local_58);
    HistogramRemap<brotli::Histogram<704>>
              ((in->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,__n,
               (out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
               (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start);
    HistogramReindex<brotli::Histogram<704>>(out,symbols);
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint32_t *)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("in_size == in.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./cluster.h"
                ,0x106,
                "void brotli::ClusterHistograms(const std::vector<HistogramType> &, size_t, size_t, size_t, std::vector<HistogramType> *, std::vector<uint32_t> *) [HistogramType = brotli::Histogram<704>]"
               );
}

Assistant:

void ClusterHistograms(const std::vector<HistogramType>& in,
                       size_t num_contexts, size_t num_blocks,
                       size_t max_histograms,
                       std::vector<HistogramType>* out,
                       std::vector<uint32_t>* histogram_symbols) {
  const size_t in_size = num_contexts * num_blocks;
  assert(in_size == in.size());
  std::vector<uint32_t> cluster_size(in_size, 1);
  out->resize(in_size);
  histogram_symbols->resize(in_size);
  for (size_t i = 0; i < in_size; ++i) {
    (*out)[i] = in[i];
    (*out)[i].bit_cost_ = PopulationCost(in[i]);
    (*histogram_symbols)[i] = static_cast<uint32_t>(i);
  }


  const size_t max_input_histograms = 64;
  for (size_t i = 0; i < in_size; i += max_input_histograms) {
    size_t num_to_combine = std::min(in_size - i, max_input_histograms);
    HistogramCombine(&(*out)[0], &cluster_size[0],
                     &(*histogram_symbols)[i], num_to_combine,
                     max_histograms);
  }

  // Collapse similar histograms.
  HistogramCombine(&(*out)[0], &cluster_size[0],
                   &(*histogram_symbols)[0], in_size,
                   max_histograms);

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(&in[0], in_size, &(*out)[0], &(*histogram_symbols)[0]);

  // Convert the context map to a canonical form.
  HistogramReindex(out, histogram_symbols);

}